

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdSplit.cpp
# Opt level: O3

int CmdSplit(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  undefined **ppuVar1;
  Datetime *rhs;
  int iVar2;
  bool verbose;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  time_t tVar5;
  ostream *poVar6;
  string *__return_storage_ptr__;
  string *psVar7;
  pointer pIVar8;
  long lVar9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  Datetime *pDVar10;
  Datetime *pDVar11;
  undefined8 *puVar12;
  iterator __end3;
  byte bVar13;
  Datetime midpoint;
  vector<Interval,_std::allocator<Interval>_> intervals;
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  IntervalFilterAllWithIds filtering;
  Datetime local_2c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_290;
  Rules *local_288;
  Journal *local_280;
  vector<Interval,_std::allocator<Interval>_> local_278;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_250 [2];
  time_t tStack_230;
  Datetime local_228;
  _Rb_tree_color local_1f8;
  bool local_1f4;
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_1d0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1a0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_170;
  undefined1 local_140 [112];
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_b0;
  IntervalFilterAllWithIds local_80;
  
  bVar13 = 0;
  ppuVar1 = (undefined **)(local_260 + 0x10);
  local_260._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"verbose","");
  verbose = Rules::getBoolean(rules,(string *)local_260,false);
  if ((undefined **)local_260._0_8_ != ppuVar1) {
    operator_delete((void *)local_260._0_8_,aaStack_250[0]._M_allocated_capacity + 1);
  }
  CLI::getIds((set<int,_std::less<int>,_std::allocator<int>_> *)&local_1a0,cli);
  if (local_1a0._M_impl.super__Rb_tree_header._M_node_count == 0) {
    psVar7 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar7 = psVar7 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar7,"IDs must be specified. See \'timew help split\'.","");
    __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Journal::startTransaction(journal);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_170,&local_1a0);
  IntervalFilterAllWithIds::IntervalFilterAllWithIds
            (&local_80,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_170);
  local_280 = journal;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_170);
  local_288 = rules;
  getTracked(&local_278,database,rules,&local_80.super_IntervalFilter);
  if (((long)local_278.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_278.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_start >> 6) * -0x5555555555555555 -
      local_1a0._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var4 = local_1a0._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &local_1a0._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      if (local_278.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_278.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0014af12:
        __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
        local_260._0_8_ = ppuVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_260,"ID \'@{1}\' does not correspond to any tracking.","");
        format<int>(__return_storage_ptr__,1,(string *)local_260,p_Var4[1]._M_color);
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
      pIVar8 = local_278.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
               super__Vector_impl_data._M_start;
      while (pIVar8->id != p_Var4[1]._M_color) {
        pIVar8 = pIVar8 + 1;
        if (pIVar8 == local_278.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                      super__Vector_impl_data._M_finish) goto LAB_0014af12;
      }
    }
  }
  if (local_278.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_278.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    rhs = (Datetime *)(local_260 + 8);
    local_290 = &_Stack_b0;
    __x = &(local_278.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
            super__Vector_impl_data._M_start)->_tags;
    do {
      pDVar10 = &(((Interval *)(__x + -3))->super_Range).start;
      pDVar11 = rhs;
      for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
        iVar2 = pDVar10->_month;
        pDVar11->_year = pDVar10->_year;
        pDVar11->_month = iVar2;
        pDVar10 = (Datetime *)((long)pDVar10 + (ulong)bVar13 * -0x10 + 8);
        pDVar11 = (Datetime *)((long)pDVar11 + (ulong)bVar13 * -0x10 + 8);
      }
      local_260._0_8_ = &PTR__Interval_0019f6e8;
      local_1f4 = *(bool *)((long)(__x + -1) + 0xc);
      local_1f8 = (((_Rb_tree_header *)((long)(__x + -1) + 8))->_M_header)._M_color;
      local_1f0._M_p = (pointer)&local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,*(_Base_ptr *)((long)(__x + -1) + 0x10),
                 (long)&(*(_Base_ptr *)((long)(__x + -1) + 0x10))->_M_color +
                 (long)&(*(_Base_ptr *)((long)(__x + -1) + 0x18))->_M_color);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree(&_Stack_1d0,&__x->_M_t);
      pDVar10 = rhs;
      puVar12 = (undefined8 *)(local_140 + 8);
      for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar12 = *(undefined8 *)pDVar10;
        pDVar10 = (Datetime *)((long)pDVar10 + (ulong)bVar13 * -0x10 + 8);
        puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
      }
      local_140._0_8_ = &PTR__Interval_0019f6e8;
      local_140[0x6c] = local_1f4;
      local_140._104_4_ = local_1f8;
      local_d0._M_p = (pointer)&local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_1f0._M_p,local_1f0._M_p + local_1e8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree(local_290,&_Stack_1d0);
      bVar3 = Range::is_open((Range *)local_260);
      if (bVar3) {
        Datetime::Datetime(&local_2c8);
        tVar5 = Datetime::operator-(&local_2c8,rhs);
        Datetime::operator-=(&local_2c8,tVar5 / 2);
      }
      else {
        local_2c8._32_8_ = aaStack_250[1]._8_8_;
        local_2c8._date = tStack_230;
        local_2c8._julian = aaStack_250[0]._8_4_;
        local_2c8._day = aaStack_250[0]._12_4_;
        local_2c8._seconds = aaStack_250[1]._0_4_;
        local_2c8._offset = aaStack_250[1]._4_4_;
        local_2c8._year = local_260._8_4_;
        local_2c8._month = local_260._12_4_;
        local_2c8._week = aaStack_250[0]._0_4_;
        local_2c8._weekday = aaStack_250[0]._4_4_;
        tVar5 = Datetime::operator-(&local_228,rhs);
        Datetime::operator+=(&local_2c8,tVar5 / 2);
      }
      local_228._0_8_ = local_2c8._0_8_;
      local_228._8_8_ = local_2c8._8_8_;
      local_228._16_8_ = local_2c8._16_8_;
      local_228._24_8_ = local_2c8._24_8_;
      local_228._32_8_ = local_2c8._32_8_;
      local_228._date = local_2c8._date;
      local_140._8_4_ = local_2c8._year;
      local_140._12_4_ = local_2c8._month;
      local_140._16_4_ = local_2c8._week;
      local_140._20_4_ = local_2c8._weekday;
      local_140._24_4_ = local_2c8._julian;
      local_140._28_4_ = local_2c8._day;
      local_140._32_4_ = local_2c8._seconds;
      local_140._36_4_ = local_2c8._offset;
      local_140._40_4_ = local_2c8._32_4_;
      local_140._44_4_ = local_2c8._36_4_;
      local_140._48_4_ = (undefined4)local_2c8._date;
      local_140._52_4_ = local_2c8._date._4_4_;
      Database::deleteInterval(database,(Interval *)(__x + -3));
      validate(cli,local_288,database,(Interval *)local_260);
      Database::addInterval(database,(Interval *)local_260,verbose);
      validate(cli,local_288,database,(Interval *)local_140);
      Database::addInterval(database,(Interval *)local_140,verbose);
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Split @",7);
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            (((_Rb_tree_header *)((long)(__x + -1) + 8))->_M_header)._M_color);
        local_2c8._year._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_2c8,1);
      }
      local_140._0_8_ = &PTR__Interval_0019f6e8;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_p != &local_c0) {
        operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
      }
      local_260._0_8_ = &PTR__Interval_0019f6e8;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&_Stack_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_p != &local_1e0) {
        operator_delete(local_1f0._M_p,local_1e0._M_allocated_capacity + 1);
      }
      pIVar8 = (pointer)(__x + 1);
      __x = __x + 4;
    } while (pIVar8 != local_278.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  Journal::endTransaction(local_280);
  std::vector<Interval,_std::allocator<Interval>_>::~vector(&local_278);
  local_80.super_IntervalFilter._vptr_IntervalFilter = (_func_int **)&PTR_accepts_0019f980;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_80._ids._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1a0);
  return 0;
}

Assistant:

int CmdSplit (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  std::set <int> ids = cli.getIds ();

  if (ids.empty ())
  {
    throw std::string ("IDs must be specified. See 'timew help split'.");
  }

  journal.startTransaction ();

  auto filtering = IntervalFilterAllWithIds (ids);
  auto intervals = getTracked (database, rules, filtering);

  if (intervals.size () != ids.size ())
  {
    for (auto& id: ids)
    {
      bool found = false;

      for (auto& interval: intervals)
      {
        if (interval.id == id)
        {
          found = true;
          break;
        }
      }
      if (! found)
      {
        throw format ("ID '@{1}' does not correspond to any tracking.", id);
      }
    }
  }

  for (const auto& interval : intervals)
  {
    Interval first = interval;
    Interval second = first;

    if (first.is_open ())
    {
      Datetime midpoint;
      midpoint -= (midpoint - first.start) / 2;
      first.end = midpoint;
      second.start = midpoint;
    }
    else
    {
      Datetime midpoint = first.start;
      midpoint += (first.end - first.start) / 2;
      first.end = midpoint;
      second.start = midpoint;
    }

    database.deleteInterval (interval);

    validate (cli, rules, database, first);
    database.addInterval (first, verbose);

    validate (cli, rules, database, second);
    database.addInterval (second, verbose);

    if (verbose)
    {
      std::cout << "Split @" << interval.id << '\n';
    }
  }

  journal.endTransaction ();

  return 0;
}